

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalNinjaMultiGenerator::ConfigDirectory
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *config)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  local_38.View_._M_len = config->_M_string_length;
  if (local_38.View_._M_len == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_68);
  }
  else {
    local_68.View_._M_str = local_68.Digits_;
    local_68.View_._M_len = 1;
    local_68.Digits_[0] = '/';
    local_38.View_._M_str = (config->_M_dataplus)._M_p;
    cmStrCat<>(__return_storage_ptr__,&local_68,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConfigDirectory(const std::string& config) const override
  {
    if (!config.empty()) {
      return cmStrCat('/', config);
    }
    return "";
  }